

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O0

void free_cmd_list(void)

{
  char **ppcVar1;
  
  if (cmd_line_list != (line_list *)0x0) {
    while (cmd_line_list != (line_list *)0x0) {
      cmd_line_list_tmp = cmd_line_list;
      ppcVar1 = &cmd_line_list->string_arg;
      cmd_line_list = cmd_line_list->next;
      free(*ppcVar1);
      free(cmd_line_list_tmp);
    }
  }
  return;
}

Assistant:

static void
free_cmd_list(void)
{
  /* free the list of a previous call */
  if (cmd_line_list)
    {
      while (cmd_line_list) {
        cmd_line_list_tmp = cmd_line_list;
        cmd_line_list = cmd_line_list->next;
        free (cmd_line_list_tmp->string_arg);
        free (cmd_line_list_tmp);
      }
    }
}